

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcTextLiteral::~IfcTextLiteral(IfcTextLiteral *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)((long)&this[-1].Path.field_2 + 8) = 0x7ecf88;
  (this->Path)._M_dataplus._M_p = (pointer)0x7ed000;
  *(undefined8 *)&this[-1].field_0x88 = 0x7ecfb0;
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7ecfd8;
  if ((Out *)*(undefined1 **)&this->field_0x40 != &this->Placement) {
    operator_delete(*(undefined1 **)&this->field_0x40,
                    (ulong)((long)&((this->Placement).
                                    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_DataType + 1));
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x38 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x38);
  }
  puVar1 = *(undefined1 **)
            &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10;
  puVar2 = &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  operator_delete((void *)((long)&this[-1].Path.field_2 + 8),0x98);
  return;
}

Assistant:

IfcTextLiteral() : Object("IfcTextLiteral") {}